

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O1

void m_dowear(level *lev,monst *mon,boolean creation)

{
  permonst *ppVar1;
  obj *poVar2;
  boolean bVar3;
  
  ppVar1 = mon->data;
  if (((ppVar1->msize == '\0') || ((ppVar1->mflags1 & 0x42000) != 0)) ||
     (((ppVar1->mflags1 >> 0x10 & 1) != 0 &&
      ((creation == '\0' || (ppVar1 != mons + 0xfe && ppVar1->mlet != '\'')))))) {
    return;
  }
  m_dowear_type(lev,mon,0x10000,creation,'\0');
  bVar3 = breakarm(mon->data);
  if (bVar3 == '\0') {
    bVar3 = sliparm(mon->data);
    if (bVar3 != '\0') goto LAB_0028b9c6;
LAB_0028b9cc:
    m_dowear_type(lev,mon,0x40,creation,'\0');
  }
  else {
LAB_0028b9c6:
    if ((mon->misc_worn_check & 1) != 0) goto LAB_0028b9cc;
  }
  bVar3 = breakarm(mon->data);
  if (bVar3 == '\0') {
    bVar3 = sliparm(mon->data);
    if (bVar3 != '\0') goto LAB_0028b9fb;
LAB_0028ba05:
    m_dowear_type(lev,mon,2,creation,'\0');
  }
  else {
LAB_0028b9fb:
    if (mon->data->msize == '\x01') goto LAB_0028ba05;
  }
  m_dowear_type(lev,mon,4,creation,'\0');
  poVar2 = mon->mw;
  if ((((poVar2 == (obj *)0x0) || ((byte)(poVar2->oclass | 4U) != 6)) ||
      ((objects[poVar2->otyp].field_0x11 & 1) == 0)) || (mon->data == mons + 0x11b)) {
    m_dowear_type(lev,mon,8,creation,'\0');
  }
  m_dowear_type(lev,mon,0x10,creation,'\0');
  if (((mon->data->mflags1 & 0x80000) == 0) && (mon->data->mlet != '\x1d')) {
    m_dowear_type(lev,mon,0x20,creation,'\0');
  }
  bVar3 = breakarm(mon->data);
  if (bVar3 == '\0') {
    bVar3 = sliparm(mon->data);
    if (bVar3 == '\0') {
      bVar3 = '\0';
      goto LAB_0028badb;
    }
  }
  bVar3 = '\x01';
LAB_0028badb:
  m_dowear_type(lev,mon,1,creation,bVar3);
  return;
}

Assistant:

void m_dowear(struct level *lev, struct monst *mon, boolean creation)
{
#define RACE_EXCEPTION TRUE
	/* Note the restrictions here are the same as in dowear in do_wear.c
	 * except for the additional restriction on intelligence.  (Players
	 * are always intelligent, even if polymorphed).
	 */
	if (verysmall(mon->data) || nohands(mon->data) || is_animal(mon->data))
		return;
	/* give mummies a chance to wear their wrappings
	 * and let skeletons wear their initial armor */
	if (mindless(mon->data) && (!creation ||
	    (mon->data->mlet != S_MUMMY && mon->data != &mons[PM_SKELETON])))
		return;

	m_dowear_type(lev, mon, W_AMUL, creation, FALSE);
	/* can't put on shirt if already wearing suit */
	if (!cantweararm(mon->data) || (mon->misc_worn_check & W_ARM))
	    m_dowear_type(lev, mon, W_ARMU, creation, FALSE);
	/* treating small as a special case allows
	   hobbits, gnomes, and kobolds to wear cloaks */
	if (!cantweararm(mon->data) || mon->data->msize == MZ_SMALL)
	    m_dowear_type(lev, mon, W_ARMC, creation, FALSE);
	m_dowear_type(lev, mon, W_ARMH, creation, FALSE);
	/* Black Marketeer can use a shield even with two-handed Thiefbane. */
	if (!MON_WEP(mon) || !bimanual(MON_WEP(mon)) ||
	    mon->data == &mons[PM_BLACK_MARKETEER])
	    m_dowear_type(lev, mon, W_ARMS, creation, FALSE);
	m_dowear_type(lev, mon, W_ARMG, creation, FALSE);
	if (!slithy(mon->data) && mon->data->mlet != S_CENTAUR)
	    m_dowear_type(lev, mon, W_ARMF, creation, FALSE);
	if (!cantweararm(mon->data))
	    m_dowear_type(lev, mon, W_ARM, creation, FALSE);
	else
	    m_dowear_type(lev, mon, W_ARM, creation, RACE_EXCEPTION);
}